

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

void handle_pp_undef(Context_conflict1 *ctx)

{
  uint uVar1;
  IncludeState *state;
  Define *def;
  long lVar2;
  byte bVar3;
  Token TVar4;
  int iVar5;
  Define **ppDVar6;
  char *pcVar7;
  Define *pDVar8;
  char *__s1;
  undefined8 uStack_40;
  char acStack_38 [8];
  
  state = ctx->include_stack;
  uStack_40 = 0x1333f2;
  TVar4 = lexer(state);
  if (TVar4 != TOKEN_IDENTIFIER) {
    pcVar7 = "Macro names must be indentifiers";
LAB_0013347c:
    fail(ctx,pcVar7);
    return;
  }
  uVar1 = state->tokenlen;
  lVar2 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
  __s1 = acStack_38 + lVar2;
  pcVar7 = state->token;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x133422;
  memcpy(__s1,pcVar7,(ulong)uVar1);
  __s1[uVar1] = '\0';
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x13342f;
  iVar5 = require_newline(state);
  if (iVar5 == 0) {
    pcVar7 = "Invalid #undef directive";
    goto LAB_0013347c;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x133442;
  iVar5 = strcmp(__s1,"__FILE__");
  if (iVar5 == 0) {
    if (ctx->file_macro == (Define *)0x0) goto LAB_001334c6;
    ppDVar6 = &ctx->file_macro;
  }
  else {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x133455;
    iVar5 = strcmp(__s1,"__LINE__");
    if ((iVar5 != 0) || (ctx->line_macro == (Define *)0x0)) goto LAB_001334c6;
    ppDVar6 = &ctx->line_macro;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1334b7;
  failf(ctx,"undefining \"%s\"",__s1);
  pDVar8 = *ppDVar6;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1334c2;
  free_define(ctx,pDVar8);
  *ppDVar6 = (Define *)0x0;
LAB_001334c6:
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1334ce;
  bVar3 = hash_define(__s1);
  ppDVar6 = ctx->define_hashtable + bVar3;
  pDVar8 = (Define *)0x0;
  while( true ) {
    def = *ppDVar6;
    if (def == (Define *)0x0) {
      return;
    }
    pcVar7 = def->identifier;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1334f5;
    iVar5 = strcmp(pcVar7,__s1);
    if (iVar5 == 0) break;
    ppDVar6 = &def->next;
    pDVar8 = def;
  }
  ppDVar6 = &pDVar8->next;
  if (pDVar8 == (Define *)0x0) {
    ppDVar6 = ctx->define_hashtable + bVar3;
  }
  *ppDVar6 = def->next;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x13351f;
  free_define(ctx,def);
  return;
}

Assistant:

static void handle_pp_undef(Context *ctx)
{
    IncludeState *state = ctx->include_stack;

    if (lexer(state) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Macro names must be indentifiers");
        return;
    } // if

    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    if (!require_newline(state))
    {
        fail(ctx, "Invalid #undef directive");
        return;
    } // if

    if (strcmp(sym, "__FILE__") == 0)
    {
        if (ctx->file_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->file_macro);
            ctx->file_macro = NULL;
        } // if
    } // if
    else if (strcmp(sym, "__LINE__") == 0)
    {
        if (ctx->line_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->line_macro);
            ctx->line_macro = NULL;
        } // if
    } // if

    remove_define(ctx, sym);
}